

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::TextFormatDecodeData::DecodeDataForString
                   (string *__return_storage_ptr__,string *input_for_decode,string *desired_output)

{
  char desired;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  string local_c8;
  undefined4 local_a8;
  char local_a1;
  int local_a0;
  int iStack_9c;
  char d;
  int y;
  int x;
  DecodeDataBuilder builder;
  string local_40;
  string *local_20;
  string *desired_output_local;
  string *input_for_decode_local;
  
  local_20 = desired_output;
  desired_output_local = input_for_decode;
  input_for_decode_local = __return_storage_ptr__;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 != 0) {
      lVar2 = std::__cxx11::string::find((char)desired_output_local,0);
      if (lVar2 == -1) {
        lVar2 = std::__cxx11::string::find((char)local_20,0);
        if (lVar2 == -1) {
          anon_unknown_0::DecodeDataBuilder::DecodeDataBuilder((DecodeDataBuilder *)&y);
          iStack_9c = 0;
          local_a0 = 0;
          do {
            uVar4 = (ulong)local_a0;
            uVar5 = std::__cxx11::string::size();
            if (uVar5 <= uVar4) {
              lVar2 = (long)iStack_9c;
              lVar7 = std::__cxx11::string::size();
              if (lVar2 == lVar7) {
                (anonymous_namespace)::DecodeDataBuilder::Finish_abi_cxx11_(&local_c8,&y);
                std::operator+(__return_storage_ptr__,&local_c8,'\0');
                std::__cxx11::string::~string((string *)&local_c8);
              }
              else {
                anon_unknown_0::DirectDecodeString(__return_storage_ptr__,local_20);
              }
LAB_003b3738:
              local_a8 = 1;
              anon_unknown_0::DecodeDataBuilder::~DecodeDataBuilder((DecodeDataBuilder *)&y);
              return __return_storage_ptr__;
            }
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
            local_a1 = *pcVar6;
            if (local_a1 == '_') {
              anon_unknown_0::DecodeDataBuilder::AddUnderscore((DecodeDataBuilder *)&y);
            }
            else {
              uVar4 = (ulong)iStack_9c;
              uVar5 = std::__cxx11::string::size();
              desired = local_a1;
              if (uVar5 <= uVar4) {
                anon_unknown_0::DirectDecodeString(__return_storage_ptr__,local_20);
                goto LAB_003b3738;
              }
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)desired_output_local);
              bVar1 = anon_unknown_0::DecodeDataBuilder::AddCharacter
                                ((DecodeDataBuilder *)&y,desired,*pcVar6);
              if (!bVar1) {
                anon_unknown_0::DirectDecodeString(__return_storage_ptr__,local_20);
                goto LAB_003b3738;
              }
              iStack_9c = iStack_9c + 1;
            }
            local_a0 = local_a0 + 1;
          } while( true );
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "error: got a null char in a string for making TextFormat data,");
      poVar3 = std::operator<<(poVar3," input: \"");
      CEscape(&local_40,desired_output_local);
      poVar3 = std::operator<<(poVar3,(string *)&local_40);
      poVar3 = std::operator<<(poVar3,"\", desired: \"");
      CEscape((string *)((long)&builder.decode_data_.field_2 + 8),local_20);
      poVar3 = std::operator<<(poVar3,(string *)(builder.decode_data_.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"\".");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)(builder.decode_data_.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_40);
      std::ostream::flush();
      abort();
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "error: got empty string for making TextFormat data, input: \"");
  poVar3 = std::operator<<(poVar3,(string *)desired_output_local);
  poVar3 = std::operator<<(poVar3,"\", desired: \"");
  poVar3 = std::operator<<(poVar3,(string *)local_20);
  poVar3 = std::operator<<(poVar3,"\".");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  abort();
}

Assistant:

string TextFormatDecodeData::DecodeDataForString(const string& input_for_decode,
                                                 const string& desired_output) {
  if ((input_for_decode.size() == 0) || (desired_output.size() == 0)) {
    cerr << "error: got empty string for making TextFormat data, input: \""
         << input_for_decode << "\", desired: \"" << desired_output << "\"."
         << endl;
    cerr.flush();
    abort();
  }
  if ((input_for_decode.find('\0') != string::npos) ||
      (desired_output.find('\0') != string::npos)) {
    cerr << "error: got a null char in a string for making TextFormat data,"
         << " input: \"" << CEscape(input_for_decode) << "\", desired: \""
         << CEscape(desired_output) << "\"." << endl;
    cerr.flush();
    abort();
  }

  DecodeDataBuilder builder;

  // Walk the output building it from the input.
  int x = 0;
  for (int y = 0; y < desired_output.size(); y++) {
    const char d = desired_output[y];
    if (d == '_') {
      builder.AddUnderscore();
      continue;
    }

    if (x >= input_for_decode.size()) {
      // Out of input, no way to encode it, just return a full decode.
      return DirectDecodeString(desired_output);
    }
    if (builder.AddCharacter(d, input_for_decode[x])) {
      ++x;  // Consumed one input
    } else {
      // Couldn't transform for the next character, just return a full decode.
      return DirectDecodeString(desired_output);
    }
  }

  if (x != input_for_decode.size()) {
    // Extra input (suffix from name sanitizing?), just return a full decode.
    return DirectDecodeString(desired_output);
  }

  // Add the end marker.
  return builder.Finish() + (char)'\0';
}